

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>
::_add_to(Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>
          *this,Column *column,Tmp_column *set,uint coef)

{
  Element EVar1;
  Column_settings *this_00;
  bool bVar2;
  Element EVar3;
  uint *puVar4;
  pointer ppVar5;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>,_bool> pVar6;
  ID_index local_64;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_> local_60;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>,_bool> res;
  Entry *entry;
  const_iterator __end0;
  const_iterator __begin0;
  Column *__range3;
  Field_operators *operators;
  uint coef_local;
  Tmp_column *set_local;
  Column *column_local;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>
  *this_local;
  
  this_00 = this->colSettings_;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>
  ::begin((Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>
           *)&__end0);
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>
  ::end((Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>
         *)&entry);
  while (bVar2 = boost::intrusive::operator!=
                           (&__end0,(list_iterator<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)1,_Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>::Matrix_column_tag,_1U>,_true>
                                     *)&entry), bVar2) {
    res._8_8_ = boost::intrusive::
                list_iterator<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)1,_Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>::Matrix_column_tag,_1U>,_true>
                ::operator*(&__end0);
    local_64 = Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>
               ::get_row_index((Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>
                                *)res._8_8_);
    puVar4 = Entry_field_element<unsigned_int>::get_element
                       ((Entry_field_element<unsigned_int> *)res._8_8_);
    pVar6 = std::
            map<unsigned_int,unsigned_int,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
            ::emplace<unsigned_int,unsigned_int_const&>
                      ((map<unsigned_int,unsigned_int,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                        *)set,&local_64,puVar4);
    local_60 = pVar6.first._M_node;
    res.first._M_node._0_1_ = pVar6.second;
    if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      puVar4 = Entry_field_element<unsigned_int>::get_element
                         ((Entry_field_element<unsigned_int> *)res._8_8_);
      EVar1 = *puVar4;
      ppVar5 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::operator->
                         (&local_60);
      persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply_and_add_inplace_back
                (&this_00->operators,EVar1,coef,&ppVar5->second);
      ppVar5 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::operator->
                         (&local_60);
      EVar1 = ppVar5->second;
      EVar3 = persistence_fields::Zp_field_operators<unsigned_int,_void>::get_additive_identity();
      if (EVar1 == EVar3) {
        std::
        map<unsigned_int,unsigned_int,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
        ::erase_abi_cxx11_((map<unsigned_int,unsigned_int,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                            *)set,(iterator)local_60._M_node);
      }
    }
    else {
      ppVar5 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::operator->
                         (&local_60);
      persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply_inplace
                (&this_00->operators,&ppVar5->second,coef);
    }
    boost::intrusive::
    list_iterator<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)1,_Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>::Matrix_column_tag,_1U>,_true>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

inline void Chain_matrix<Master_matrix>::_add_to(const Column& column,
                                                 Tmp_column& set,
                                                 [[maybe_unused]] unsigned int coef)
{
  if constexpr (Master_matrix::Option_list::is_z2) {
    std::pair<typename std::set<Index>::iterator, bool> res_insert;
    for (const Entry& entry : column) {
      res_insert = set.insert(entry.get_row_index());
      if (!res_insert.second) {
        set.erase(res_insert.first);
      }
    }
  } else {
    auto& operators = colSettings_->operators;
    for (const Entry& entry : column) {
      auto res = set.emplace(entry.get_row_index(), entry.get_element());
      if (res.second){
        operators.multiply_inplace(res.first->second, coef);
      } else {
        operators.multiply_and_add_inplace_back(entry.get_element(), coef, res.first->second);
        if (res.first->second == Field_operators::get_additive_identity()) {
          set.erase(res.first);
        }
      }
    }
  }
}